

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong uVar4;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0x118,8);
    if (this->nStored != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
                  (&this->alloc,
                   (Image *)((long)&((Image *)CONCAT44(extraout_var,iVar2))->format + lVar3),
                   (Image *)((long)&this->ptr->format + lVar3));
        pmr::polymorphic_allocator<pbrt::Image>::destroy<pbrt::Image>
                  (&this->alloc,(Image *)((long)&this->ptr->format + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x118;
      } while (uVar4 < this->nStored);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x118,8);
    this->nAlloc = n;
    this->ptr = (Image *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }